

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  cpp_dec_float<200U,_int,_void> *pcVar1;
  fpclass_type fVar2;
  int iVar3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps_00;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  bool bVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  uint *puVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  uint *puVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  byte bVar17;
  undefined1 auStack_480 [11];
  undefined1 local_475;
  int j;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_470;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_468;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_460;
  int *local_458;
  int32_t local_450;
  int local_44c;
  int *local_448;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_440;
  int *local_438;
  int *local_430;
  int *local_428;
  undefined1 local_420 [4] [24];
  int local_3b0;
  bool local_3ac;
  fpclass_type local_3a8;
  int32_t local_3a4;
  int j_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  uint local_130 [28];
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar17 = 0;
  puVar12 = (uint *)eps;
  puVar14 = local_b0;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar14 = *puVar12;
    puVar12 = puVar12 + 1;
    puVar14 = puVar14 + 1;
  }
  local_40 = (eps->m_backend).exp;
  local_3c = (eps->m_backend).neg;
  local_38._0_4_ = (eps->m_backend).fpclass;
  local_38._4_4_ = (eps->m_backend).prec_elem;
  local_470 = eps;
  local_460 = rhs;
  vSolveLright(this,rhs,ridx,&rn,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_b0);
  local_468 = this;
  local_440 = vec;
  if (forest == (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0x0) {
    local_458 = (this->row).perm;
    j_1 = 0;
    for (lVar6 = 0; iVar5 = j_1, lVar6 < rn; lVar6 = lVar6 + 1) {
      iVar5 = ridx[lVar6];
      pcVar1 = &local_460[iVar5].m_backend;
      iVar3 = local_460[iVar5].m_backend.exp;
      bVar4 = local_460[iVar5].m_backend.neg;
      lVar7 = 0x1c;
      pcVar10 = pcVar1;
      pnVar11 = &local_2b0;
      for (lVar9 = lVar7; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = (pcVar10->data)._M_elems[0];
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar17 * -8 + 4);
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      local_2b0.m_backend.fpclass = local_460[iVar5].m_backend.fpclass;
      local_2b0.m_backend.prec_elem = local_460[iVar5].m_backend.prec_elem;
      pnVar11 = local_470;
      pnVar15 = &local_330;
      local_2b0.m_backend.exp = iVar3;
      local_2b0.m_backend.neg = bVar4;
      for (; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar15->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
        pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar15 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      local_330.m_backend.exp = (local_470->m_backend).exp;
      local_330.m_backend.neg = (local_470->m_backend).neg;
      local_330.m_backend.fpclass = (local_470->m_backend).fpclass;
      local_330.m_backend.prec_elem = (local_470->m_backend).prec_elem;
      bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_2b0,&local_330);
      if (bVar4) {
        enQueueMax(ridx,&j_1,local_458[iVar5]);
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar1,0);
      }
    }
  }
  else {
    local_448 = forestIdx;
    local_430 = (this->row).perm;
    j = 0;
    lVar6 = 0x1c;
    piVar8 = (int *)0x0;
    local_438 = ridx;
    local_428 = idx;
    while ((long)piVar8 < (long)rn) {
      iVar5 = local_438[(long)piVar8];
      pcVar1 = &local_460[iVar5].m_backend;
      pcVar10 = pcVar1;
      puVar12 = (uint *)&j_1;
      for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar12 = (pcVar10->data)._M_elems[0];
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar17 * -8 + 4);
        puVar12 = puVar12 + (ulong)bVar17 * -2 + 1;
      }
      local_44c = local_460[iVar5].m_backend.exp;
      local_475 = local_460[iVar5].m_backend.neg;
      fVar2 = local_460[iVar5].m_backend.fpclass;
      local_450 = local_460[iVar5].m_backend.prec_elem;
      pcVar10 = pcVar1;
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_420;
      for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = (pcVar10->data)._M_elems[0];
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar17 * -8 + 4);
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      pnVar11 = local_470;
      pnVar15 = &local_230;
      for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar15->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
        pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar15 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      local_230.m_backend.exp = (local_470->m_backend).exp;
      local_230.m_backend.neg = (local_470->m_backend).neg;
      local_230.m_backend.fpclass = (local_470->m_backend).fpclass;
      local_230.m_backend.prec_elem = (local_470->m_backend).prec_elem;
      local_458 = piVar8;
      local_3b0 = local_44c;
      local_3ac = (bool)local_475;
      local_3a8 = fVar2;
      local_3a4 = local_450;
      bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_420,&local_230);
      if (bVar4) {
        *local_448 = iVar5;
        local_448 = local_448 + 1;
        enQueueMax(local_438,&j,local_430[iVar5]);
        puVar12 = (uint *)&j_1;
        pnVar11 = forest + iVar5;
        for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar11->m_backend).data._M_elems[0] = *puVar12;
          puVar12 = puVar12 + (ulong)bVar17 * -2 + 1;
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
        }
        forest[iVar5].m_backend.exp = local_44c;
        forest[iVar5].m_backend.neg = (bool)local_475;
        forest[iVar5].m_backend.fpclass = fVar2;
        forest[iVar5].m_backend.prec_elem = local_450;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar1,0);
      }
      piVar8 = (int *)((long)local_458 + 1);
    }
    *forestNum = j;
    idx = local_428;
    ridx = local_438;
    iVar5 = j;
  }
  pnVar15 = local_440;
  this_00 = local_468;
  pnVar11 = local_470;
  pnVar13 = local_470;
  puVar12 = local_130;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar12 = (pnVar13->m_backend).data._M_elems[0];
    pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar13 + ((ulong)bVar17 * -2 + 1) * 4);
    puVar12 = puVar12 + (ulong)bVar17 * -2 + 1;
  }
  local_c0 = (local_470->m_backend).exp;
  local_bc = (local_470->m_backend).neg;
  local_b8._0_4_ = (local_470->m_backend).fpclass;
  local_b8._4_4_ = (local_470->m_backend).prec_elem;
  eps_00.m_backend.data._M_elems._8_11_ = auStack_480;
  eps_00.m_backend.data._M_elems._0_8_ = local_130;
  eps_00.m_backend.data._M_elems[4]._3_1_ = local_475;
  eps_00.m_backend.data._M_elems[5] = j;
  eps_00.m_backend.data._M_elems._24_8_ = local_470;
  eps_00.m_backend.data._M_elems._32_8_ = local_468;
  eps_00.m_backend.data._M_elems._40_8_ = local_460;
  eps_00.m_backend.data._M_elems._48_8_ = local_458;
  eps_00.m_backend.data._M_elems[0xe] = local_450;
  eps_00.m_backend.data._M_elems[0xf] = local_44c;
  eps_00.m_backend.data._M_elems._64_8_ = local_448;
  eps_00.m_backend.data._M_elems._72_8_ = local_440;
  eps_00.m_backend.data._M_elems._80_8_ = local_438;
  eps_00.m_backend.data._M_elems._88_8_ = local_430;
  eps_00.m_backend.data._M_elems._96_8_ = local_428;
  eps_00.m_backend.data._M_elems[0x1a] = local_420[0]._0_4_;
  eps_00.m_backend.data._M_elems[0x1b] = local_420[0]._4_4_;
  eps_00.m_backend.exp = local_420[0]._8_4_;
  eps_00.m_backend.neg = (bool)local_420[0][0xc];
  eps_00.m_backend._117_3_ = local_420[0]._13_3_;
  eps_00.m_backend.fpclass = local_420[0]._16_4_;
  eps_00.m_backend.prec_elem = local_420[0]._20_4_;
  rn = iVar5;
  iVar5 = vSolveUright(local_468,local_440,idx,local_460,ridx,iVar5,eps_00);
  if ((this_00->l).updateType == 0) {
    pnVar13 = pnVar11;
    pnVar16 = &local_1b0;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar17 * -2 + 1) * 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = (pnVar11->m_backend).exp;
    local_1b0.m_backend.neg = (pnVar11->m_backend).neg;
    local_1b0.m_backend.fpclass = (pnVar11->m_backend).fpclass;
    local_1b0.m_backend.prec_elem = (pnVar11->m_backend).prec_elem;
    rn = iVar5;
    iVar5 = vSolveUpdateRight(this_00,pnVar15,idx,iVar5,&local_1b0);
  }
  return iVar5;
}

Assistant:

int CLUFactor<R>::vSolveRight4update(R eps,
                                     R* vec, int* idx,                       /* result */
                                     R* rhs, int* ridx, int rn,              /* rhs    */
                                     R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright(rhs, ridx, rn, eps);
   assert(rn >= 0 && rn <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
      rn = vSolveUpdateRight(vec, idx, rn, eps);

   return rn;
}